

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::anon_unknown_2::
     GenerateDocCommentBody<google::protobuf::FieldDescriptor>
               (Printer *printer,FieldDescriptor *descriptor)

{
  bool bVar1;
  int in_R8D;
  SourceLocation location;
  undefined1 local_80 [48];
  _Alloc_hider local_50;
  undefined1 local_48 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  local_80._24_8_ = 0;
  local_80[0x20] = '\0';
  local_48._0_8_ = 0;
  local_48[8] = '\0';
  local_30.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._16_8_ = local_80 + 0x20;
  local_50._M_p = local_48 + 8;
  bVar1 = FieldDescriptor::GetSourceLocation(descriptor,(SourceLocation *)local_80);
  if (bVar1) {
    GenerateDocCommentBodyForLocation
              ((anon_unknown_2 *)printer,(Printer *)local_80,(SourceLocation *)0x1,false,in_R8D);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  if (local_50._M_p != local_48 + 8) {
    operator_delete(local_50._M_p);
  }
  if ((undefined1 *)local_80._16_8_ != local_80 + 0x20) {
    operator_delete((void *)local_80._16_8_);
  }
  return;
}

Assistant:

static void GenerateDocCommentBody(
    io::Printer* printer, const DescriptorType* descriptor) {
  SourceLocation location;
  if (descriptor->GetSourceLocation(&location)) {
    GenerateDocCommentBodyForLocation(printer, location, true, 0);
  }
}